

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.hpp
# Opt level: O2

pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
* __thiscall
jessilib::
word_split_once<std::basic_string_view<char,std::char_traits<char>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          begin,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                end,char in_whitespace)

{
  jessilib *pjVar1;
  jessilib jVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  size_t sVar4;
  jessilib *pjVar5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  
  jVar2 = SUB81(end._M_current,0);
  if (begin._M_current <= this) {
    (__return_storage_ptr__->second)._M_len = 0;
    (__return_storage_ptr__->second)._M_str = (char *)0x0;
    (__return_storage_ptr__->first)._M_len = 0;
    (__return_storage_ptr__->first)._M_str = (char *)0x0;
    return __return_storage_ptr__;
  }
  for (; (_Var3._M_current = begin._M_current, this != (jessilib *)begin._M_current &&
         (_Var3._M_current = (char *)this, *this == jVar2)); this = this + 1) {
  }
  sVar4 = 0;
  while( true ) {
    if ((jessilib *)_Var3._M_current + sVar4 == (jessilib *)begin._M_current) {
      (__return_storage_ptr__->first)._M_len = (long)begin._M_current - (long)_Var3._M_current;
      (__return_storage_ptr__->first)._M_str = _Var3._M_current;
      (__return_storage_ptr__->second)._M_len = 0;
      (__return_storage_ptr__->second)._M_str = (char *)0x0;
      return __return_storage_ptr__;
    }
    if (((jessilib *)_Var3._M_current)[sVar4] == jVar2) break;
    sVar4 = sVar4 + 1;
  }
  pjVar1 = (jessilib *)_Var3._M_current + sVar4 + 1;
  do {
    pjVar5 = pjVar1;
    _Var6._M_current = begin._M_current;
    if (pjVar5 == (jessilib *)begin._M_current) break;
    pjVar1 = pjVar5 + 1;
    _Var6._M_current = (char *)pjVar5;
  } while (*pjVar5 == jVar2);
  (__return_storage_ptr__->first)._M_len = sVar4;
  (__return_storage_ptr__->first)._M_str = _Var3._M_current;
  (__return_storage_ptr__->second)._M_len = (long)begin._M_current - (long)_Var6._M_current;
  (__return_storage_ptr__->second)._M_str = _Var6._M_current;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto word_split_once(ItrT begin, EndT end, ElementT in_whitespace) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to word_split
		return result;
	}

	while (begin != end
		&& *begin == in_whitespace) {
		++begin;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_whitespace) {
			// in_whitespace found; word_split upon it
			result.first = make_word_split_member<MemberT>(begin, itr);

			++itr;
			while (itr != end
				&& *itr == in_whitespace) {
				++itr;
			}

			result.second = make_word_split_member<MemberT>(itr, end);
			return result;
		}
	}

	// in_whitespace not found
	result.first = make_word_split_member<MemberT>(begin, end);
	return result;
}